

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)

{
  SQObjectType SVar1;
  SQObjectPtr *o_00;
  SQString *x;
  SQChar *pSVar2;
  SQObjectPtr oval;
  SQObjectPtr local_30;
  
  o_00 = stack_get(v,idx);
  *o = o_00;
  SVar1 = (o_00->super_SQObject)._type;
  if (SVar1 != type) {
    x = SQVM::PrintObjVal(v,o_00);
    SQObjectPtr::SQObjectPtr(&local_30,x);
    pSVar2 = IdType2Name(type);
    SQVM::Raise_Error(v,"wrong argument type, expected \'%s\' got \'%.50s\'",pSVar2,
                      &(local_30.super_SQObject._unVal.pTable)->_firstfree);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  return SVar1 == type;
}

Assistant:

static bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)
{
    *o = &stack_get(v,idx);
    if(type(**o) != type){
        SQObjectPtr oval = v->PrintObjVal(**o);
        v->Raise_Error(_SC("wrong argument type, expected '%s' got '%.50s'"),IdType2Name(type),_stringval(oval));
        return false;
    }
    return true;
}